

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execExgDxDy<(moira::Instr)63,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  undefined4 uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(opcode >> 9 & 7);
  uVar1 = *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) =
       *(undefined4 *)((long)this->exec + uVar2 * 4 + -0x58);
  *(undefined4 *)((long)this->exec + uVar2 * 4 + -0x58) = uVar1;
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,2);
  return;
}

Assistant:

void
Moira::execExgDxDy(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    std::swap(reg.d[src], reg.d[dst]);
    prefetch<POLLIPL>();

    sync(2);
}